

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  undefined4 uVar3;
  RenderTarget renderTarget;
  RenderTarget renderTarget_00;
  TestContext *testCtx;
  char *__s;
  TestNode *pTVar4;
  TestNode *pTVar5;
  BaseTriangleCase *pBVar6;
  PointCase *pPVar7;
  FillRuleCase *pFVar8;
  BaseRenderingCase *this_00;
  long lVar9;
  long lVar10;
  TriangleInterpolationTest *pTVar11;
  LineInterpolationTest *pLVar12;
  undefined8 extraout_RAX;
  undefined8 uVar13;
  TestNode *pTVar14;
  undefined8 extraout_RAX_00;
  RenderTarget in_R8D;
  PrimitiveWideness PVar15;
  undefined8 uVar16;
  int in_R9D;
  RenderTarget RVar17;
  undefined8 uVar18;
  int iVar19;
  RenderTarget numSamples;
  allocator<char> local_c9;
  long local_c8;
  TestNode *local_c0;
  TestNode *local_b8;
  long local_b0;
  long local_a8;
  CullMode *local_a0;
  char *local_98;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar5 = (TestNode *)operator_new(0xd8);
  anon_unknown_1::TrianglesCase::TrianglesCase
            ((TrianglesCase *)pTVar5,(this->super_TestCaseGroup).m_context,(char *)0x0,
             (char *)0xffffffffffffffff,in_R8D,in_R9D);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pBVar6 = (BaseTriangleCase *)operator_new(0xd8);
  anon_unknown_1::BaseTriangleCase::BaseTriangleCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result",5,
             RENDERTARGET_DEFAULT,-1);
  (pBVar6->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_01e21a98;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar6);
  pBVar6 = (BaseTriangleCase *)operator_new(0xd8);
  anon_unknown_1::BaseTriangleCase::BaseTriangleCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result",6,
             RENDERTARGET_DEFAULT,-1);
  (pBVar6->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_01e21b00;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar6);
  pTVar5 = (TestNode *)operator_new(0xf8);
  iVar19 = -1;
  RVar17 = RENDERTARGET_DEFAULT;
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar5,(this->super_TestCaseGroup).m_context,"lines",
             "Render primitives as GL_LINES, verify rasterization result",PRIMITIVEWIDENESS_NARROW,
             RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar5,(this->super_TestCaseGroup).m_context,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW,RVar17,iVar19);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar5,(this->super_TestCaseGroup).m_context,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW,RVar17,iVar19);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xf8);
  iVar19 = -1;
  RVar17 = RENDERTARGET_DEFAULT;
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar5,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xf8);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar5,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE,RVar17,iVar19);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xf8);
  PVar15 = PRIMITIVEWIDENESS_WIDE;
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar5,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE,RVar17,iVar19);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pPVar7 = (PointCase *)operator_new(0xf0);
  anon_unknown_1::PointCase::PointCase
            (pPVar7,(this->super_TestCaseGroup).m_context,(char *)0x0,(char *)0xffffffffffffffff,
             PVar15,RVar17,iVar19);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pPVar7);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pFVar8 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"basic_quad",(char *)0x0,
             FILLRULECASE_BASIC,~RENDERTARGET_DEFAULT,iVar19);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"basic_quad_reverse",&DAT_00000001,
             FILLRULECASE_BASIC,~RENDERTARGET_DEFAULT,iVar19);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"clipped_full",(char *)0x2,
             FILLRULECASE_BASIC,~RENDERTARGET_DEFAULT,iVar19);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"clipped_partly",(char *)0x3,
             FILLRULECASE_BASIC,~RENDERTARGET_DEFAULT,iVar19);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pFVar8 = (FillRuleCase *)operator_new(0xd8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar8,(this->super_TestCaseGroup).m_context,"projected",&DAT_00000004,
             FILLRULECASE_BASIC,~RENDERTARGET_DEFAULT,iVar19);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pFVar8);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar10 = 0;
  local_b8 = (TestNode *)this;
  while (lVar10 != 3) {
    local_a0 = init::cullModes + lVar10;
    local_98 = init::cullModes[lVar10].prefix;
    lVar9 = 0;
    local_b0 = lVar10;
    while (lVar9 != 3) {
      local_c0 = (TestNode *)(init::primitiveTypes + lVar9);
      local_c8 = 0;
      local_a8 = lVar9;
      while( true ) {
        if (local_c8 == 0x20) break;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,local_98,&local_c9);
        std::operator+(&local_50,&local_70,(char *)local_c0->m_testCtx);
        std::operator+(&name,&local_50,*(char **)((long)&init::frontOrders[0].postfix + local_c8));
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = (BaseRenderingCase *)operator_new(0xd0);
        GVar1 = local_a0->mode;
        GVar2 = *(GLenum *)&local_c0->_vptr_TestNode;
        uVar3 = *(undefined4 *)((long)&init::frontOrders[0].mode + local_c8);
        anon_unknown_1::BaseRenderingCase::BaseRenderingCase
                  (this_00,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   name._M_dataplus._M_p,"Test primitive culling.",RENDERTARGET_DEFAULT,-1,0x100);
        (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BaseRenderingCase_01e21dc8;
        *(GLenum *)&this_00->field_0xc4 = GVar1;
        *(GLenum *)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = GVar2;
        *(undefined4 *)
         ((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar3
        ;
        tcu::TestNode::addChild(pTVar4,(TestNode *)this_00);
        this = (RasterizationTests *)local_b8;
        std::__cxx11::string::~string((string *)&name);
        local_c8 = local_c8 + 0x10;
      }
      local_c8 = 0x20;
      lVar9 = local_a8 + 1;
    }
    lVar10 = local_b0 + 1;
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"interpolation",
             "Test interpolation");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"basic",
             "Non-projective interpolation");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",4,0,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",5,0,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",6,0,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,0,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"projected",
             "Projective interpolation");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle interpolation",4,2,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip interpolation",5,2,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan interpolation",6,2,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,2,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,
             -1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"flatshading","Test flatshading")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
             "Verify triangle flatshading",4,4,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_strip",
             "Verify triangle strip flatshading",5,4,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar11);
  pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangle_fan",
             "Verify triangle fan flatshading",6,4,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar11);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line flatshading",1,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip flatshading",3,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop flatshading",2,4,PRIMITIVEWIDENESS_NARROW,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line flatshading",1,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip flatshading",3,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1
            );
  tcu::TestNode::addChild(pTVar4,(TestNode *)pLVar12);
  pLVar12 = (LineInterpolationTest *)operator_new(0x148);
  uVar16 = 2;
  uVar18 = 4;
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop flatshading",2,4,PRIMITIVEWIDENESS_WIDE,RENDERTARGET_DEFAULT,-1)
  ;
  tcu::TestNode::addChild(pTVar4,(TestNode *)pLVar12);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"fbo",
             "Test using framebuffer objects");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar10 = 0;
  uVar13 = extraout_RAX;
  local_c0 = pTVar4;
  while( true ) {
    RVar17 = (RenderTarget)uVar16;
    iVar19 = (int)uVar18;
    if (lVar10 == 0x40) break;
    pTVar4 = (TestNode *)operator_new(0x70);
    testCtx = ((TestNode *)this)->m_testCtx;
    __s = *(char **)((long)&init::renderTargets[0].name + lVar10);
    local_c8 = lVar10;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_c9);
    std::operator+(&local_50,"Test using ",&local_70);
    std::operator+(&name,&local_50," color attachment");
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,testCtx,__s,name._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    tcu::TestNode::addChild(local_c0,pTVar4);
    pTVar5 = (TestNode *)operator_new(0x70);
    this = (RasterizationTests *)local_b8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_b8->m_testCtx,"primitives","Primitive rasterization");
    tcu::TestNode::addChild(pTVar4,pTVar5);
    pTVar14 = (TestNode *)operator_new(0xd8);
    renderTarget = *(RenderTarget *)((long)&init::renderTargets[0].target + local_c8);
    renderTarget_00 = *(RenderTarget *)((long)&init::renderTargets[0].numSamples + local_c8);
    anon_unknown_1::TrianglesCase::TrianglesCase
              ((TrianglesCase *)pTVar14,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode
               ,(char *)(ulong)renderTarget,(char *)(ulong)renderTarget_00,RVar17,iVar19);
    tcu::TestNode::addChild(pTVar5,pTVar14);
    pTVar14 = (TestNode *)operator_new(0xf8);
    anon_unknown_1::LinesCase::LinesCase
              ((LinesCase *)pTVar14,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "lines","Render primitives as GL_LINES, verify rasterization result",
               PRIMITIVEWIDENESS_NARROW,renderTarget,renderTarget_00);
    tcu::TestNode::addChild(pTVar5,pTVar14);
    pTVar14 = (TestNode *)operator_new(0xf8);
    PVar15 = PRIMITIVEWIDENESS_WIDE;
    RVar17 = renderTarget;
    numSamples = renderTarget_00;
    anon_unknown_1::LinesCase::LinesCase
              ((LinesCase *)pTVar14,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "lines_wide",
               "Render primitives as GL_LINES with wide lines, verify rasterization result",
               PRIMITIVEWIDENESS_WIDE,renderTarget,renderTarget_00);
    tcu::TestNode::addChild(pTVar5,pTVar14);
    pPVar7 = (PointCase *)operator_new(0xf0);
    anon_unknown_1::PointCase::PointCase
              (pPVar7,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               (char *)(ulong)renderTarget,(char *)(ulong)renderTarget_00,PVar15,RVar17,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pPVar7);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"fill_rules",
               "Primitive fill rules");
    tcu::TestNode::addChild(pTVar4,pTVar5);
    pFVar8 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"basic_quad",
               (char *)0x0,renderTarget,renderTarget_00,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar8);
    pFVar8 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               "basic_quad_reverse",&DAT_00000001,renderTarget,renderTarget_00,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar8);
    pFVar8 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"clipped_full",
               (char *)0x2,renderTarget,renderTarget_00,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar8);
    pFVar8 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"clipped_partly",
               (char *)0x3,renderTarget,renderTarget_00,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar8);
    pFVar8 = (FillRuleCase *)operator_new(0xd8);
    anon_unknown_1::FillRuleCase::FillRuleCase
              (pFVar8,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"projected",
               &DAT_00000004,renderTarget,renderTarget_00,numSamples);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pFVar8);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"interpolation",
               "Non-projective interpolation");
    tcu::TestNode::addChild(pTVar4,pTVar5);
    pTVar11 = (TriangleInterpolationTest *)operator_new(0xd8);
    anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
              (pTVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"triangles",
               "Verify triangle interpolation",4,0,renderTarget,renderTarget_00);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar11);
    pLVar12 = (LineInterpolationTest *)operator_new(0x148);
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
               "Verify line interpolation",1,0,PRIMITIVEWIDENESS_NARROW,renderTarget,renderTarget_00
              );
    tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
    pLVar12 = (LineInterpolationTest *)operator_new(0x148);
    uVar16 = 1;
    uVar18 = 0;
    anon_unknown_1::LineInterpolationTest::LineInterpolationTest
              (pLVar12,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
               "Verify wide line interpolation",1,0,PRIMITIVEWIDENESS_WIDE,renderTarget,
               renderTarget_00);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pLVar12);
    lVar10 = local_c8 + 0x10;
    uVar13 = extraout_RAX_00;
  }
  return (int)uVar13;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(m_testCtx, "flatshading", "Test flatshading");

		addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle flatshading",			GL_TRIANGLES,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip flatshading",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan flatshading",		GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line flatshading",				GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip flatshading",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop flatshading",			GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line flatshading",			GL_LINES,			INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip flatshading",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop flatshading",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	// .fbo
	{
		static const struct
		{
			const char*						name;
			BaseRenderingCase::RenderTarget	target;
			int								numSamples;
		} renderTargets[] =
		{
			{ "texture_2d",				BaseRenderingCase::RENDERTARGET_TEXTURE_2D,			-1									},
			{ "rbo_singlesample",		BaseRenderingCase::RENDERTARGET_RBO_SINGLESAMPLE,	-1									},
			{ "rbo_multisample_4",		BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	4									},
			{ "rbo_multisample_max",	BaseRenderingCase::RENDERTARGET_RBO_MULTISAMPLE,	BaseRenderingCase::SAMPLE_COUNT_MAX	},
		};

		tcu::TestCaseGroup* const fboGroup = new tcu::TestCaseGroup(m_testCtx, "fbo", "Test using framebuffer objects");
		addChild(fboGroup);

		// .texture_2d
		// .rbo_singlesample
		// .rbo_multisample_4
		// .rbo_multisample_max
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++targetNdx)
		{
			tcu::TestCaseGroup* const colorAttachmentGroup = new tcu::TestCaseGroup(m_testCtx, renderTargets[targetNdx].name, ("Test using " + std::string(renderTargets[targetNdx].name) + " color attachment").c_str());
			fboGroup->addChild(colorAttachmentGroup);

			// .primitives
			{
				tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");
				colorAttachmentGroup->addChild(primitiveGroup);

				primitiveGroup->addChild(new TrianglesCase	(m_context, "triangles",	"Render primitives as GL_TRIANGLES, verify rasterization result",											renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines",		"Render primitives as GL_LINES, verify rasterization result",					PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new LinesCase		(m_context, "lines_wide",	"Render primitives as GL_LINES with wide lines, verify rasterization result",	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				primitiveGroup->addChild(new PointCase		(m_context, "points",		"Render primitives as GL_POINTS, verify rasterization result",					PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .fill_rules
			{
				tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

				colorAttachmentGroup->addChild(fillRules);

				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC,			renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}

			// .interpolation
			{
				tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Non-projective interpolation");

				colorAttachmentGroup->addChild(interpolation);

				interpolation->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE,								renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
				interpolation->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		renderTargets[targetNdx].target, renderTargets[targetNdx].numSamples));
			}
		}
	}
}